

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O3

int libssh2_base64_decode(LIBSSH2_SESSION *session,char **data,uint *datalen,char *src,uint src_len)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  byte bVar9;
  char cVar10;
  
  pcVar3 = (char *)(*session->alloc)(1,&session->abstract);
  *data = pcVar3;
  if (pcVar3 == (char *)0x0) {
    if ((session->err_flags & 1) != 0) {
      (*session->free)(session->err_msg,&session->abstract);
    }
    session->err_code = -6;
    session->err_flags = 0;
    session->err_msg = "Unable to allocate memory for base64 decoding";
    iVar2 = -6;
  }
  else {
    iVar2 = 0;
    uVar5 = 0;
    if (src_len != 0) {
      pbVar4 = (byte *)(src + src_len);
      uVar7 = 0;
      uVar8 = 0;
      do {
        uVar1 = base64_reverse_table[(byte)*src];
        if ((short)uVar1 < 0) goto LAB_00115f16;
        bVar9 = (byte)uVar1;
        iVar6 = (int)uVar7;
        switch((int)uVar8 % 4) {
        case 0:
          pcVar3[iVar6] = bVar9 * '\x04';
          break;
        case 1:
          pcVar3[iVar6] = pcVar3[iVar6] | (byte)(uVar1 >> 4);
          cVar10 = bVar9 << 4;
          goto LAB_00115f0f;
        case 2:
          pcVar3[iVar6] = pcVar3[iVar6] | (byte)(uVar1 >> 2);
          cVar10 = bVar9 << 6;
LAB_00115f0f:
          uVar7 = (long)iVar6 + 1;
          pcVar3[(long)iVar6 + 1] = cVar10;
          break;
        case 3:
          uVar7 = (ulong)(iVar6 + 1);
          pcVar3[iVar6] = pcVar3[iVar6] | bVar9;
        }
        uVar8 = uVar8 + 1;
LAB_00115f16:
        uVar5 = (uint)uVar7;
        src = (char *)((byte *)src + 1);
      } while (src < pbVar4);
      if ((uVar8 & 0x80000003) == 1) {
        (*session->free)(*data,&session->abstract);
        if ((session->err_flags & 1) != 0) {
          (*session->free)(session->err_msg,&session->abstract);
        }
        session->err_code = -0x22;
        session->err_flags = 0;
        session->err_msg = "Invalid base64";
        return -0x22;
      }
    }
    *datalen = uVar5;
  }
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_base64_decode(LIBSSH2_SESSION *session, char **data,
                      unsigned int *datalen, const char *src,
                      unsigned int src_len)
{
    unsigned char *s, *d;
    short v;
    int i = 0, len = 0;

    *data = LIBSSH2_ALLOC(session, (3 * src_len / 4) + 1);
    d = (unsigned char *) *data;
    if (!d) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for base64 decoding");
    }

    for(s = (unsigned char *) src; ((char *) s) < (src + src_len); s++) {
        if ((v = base64_reverse_table[*s]) < 0)
            continue;
        switch (i % 4) {
        case 0:
            d[len] = (unsigned char)(v << 2);
            break;
        case 1:
            d[len++] |= v >> 4;
            d[len] = (unsigned char)(v << 4);
            break;
        case 2:
            d[len++] |= v >> 2;
            d[len] = (unsigned char)(v << 6);
            break;
        case 3:
            d[len++] |= v;
            break;
        }
        i++;
    }
    if ((i % 4) == 1) {
        /* Invalid -- We have a byte which belongs exclusively to a partial
           octet */
        LIBSSH2_FREE(session, *data);
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL, "Invalid base64");
    }

    *datalen = len;
    return 0;
}